

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

TestObjectList * __thiscall
anon_unknown.dwarf_633d3::IntrusiveListTest::NewList
          (TestObjectList *__return_storage_ptr__,IntrusiveListTest *this,
          vector<int,_std::allocator<int>_> *data_values)

{
  int iVar1;
  GTestFlagSaver *pGVar2;
  tuple<(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
  in_RAX;
  GTestFlagSaver *pGVar3;
  __uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_38;
  
  __return_storage_ptr__->first_ = (TestObject *)0x0;
  __return_storage_ptr__->last_ = (TestObject *)0x0;
  __return_storage_ptr__->size_ = 0;
  pGVar2 = (this->super_Test).gtest_flag_saver_.ptr_;
  local_38._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
        )(tuple<(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
          )in_RAX.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl;
  for (pGVar3 = (GTestFlagSaver *)(this->super_Test)._vptr_Test; pGVar3 != pGVar2;
      pGVar3 = (GTestFlagSaver *)&pGVar3->field_0x4) {
    iVar1 = *(int *)pGVar3;
    local_38._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
    .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl =
         (tuple<(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
          )operator_new(0x20);
    (((TestObject *)
     local_38._M_t.
     super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
     .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl)->
    super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0;
    (((TestObject *)
     local_38._M_t.
     super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
     .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl)->
    super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0;
    ((TestObject *)
    local_38._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
    .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl)->data = iVar1;
    ((TestObject *)
    local_38._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
    .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl)->data2 = 0;
    ((TestObject *)
    local_38._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
    .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl)->moved = false;
    (anonymous_namespace)::TestObject::creation_count =
         (anonymous_namespace)::TestObject::creation_count + 1;
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_back
              (__return_storage_ptr__,
               (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                *)&local_38);
    std::
    unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                   *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

TestObjectList NewList(const std::vector<int>& data_values) {
    TestObjectList result;
    for (auto data_value : data_values)
      result.emplace_back(data_value);
    return result;
  }